

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketConnectionTests::TestSessionConnectionReadSocket_SessionMissing_NoMessagesReadHelper::
RunImpl(TestSessionConnectionReadSocket_SessionMissing_NoMessagesReadHelper *this)

{
  int iVar1;
  TestResults *this_00;
  byte bVar2;
  bool bVar3;
  SocketConnection *__p;
  pointer pSVar4;
  TestResults **ppTVar5;
  TestDetails **ppTVar6;
  TestDetails local_1b8;
  SocketConnector local_198 [8];
  SocketConnector connector;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> local_80;
  undefined1 local_40 [8];
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  TestSessionConnectionReadSocket_SessionMissing_NoMessagesReadHelper *this_local;
  
  sessions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             local_40);
  __p = (SocketConnection *)operator_new(0x2180);
  iVar1 = (this->super_TestSessionConnection).super_BaseSocketConnection.socket;
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&local_80,
             (set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             local_40);
  FIX::SocketConnection::SocketConnection
            (__p,iVar1,&local_80,
             &(this->super_TestSessionConnection).super_BaseSocketConnection.monitor);
  std::unique_ptr<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>::reset
            (&(this->super_TestSessionConnection).pSocketConnection,__p);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            (&local_80);
  FIX::SocketConnector::SocketConnector(local_198,0);
  pSVar4 = std::unique_ptr<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>::
           operator->(&(this->super_TestSessionConnection).pSocketConnection);
  bVar2 = FIX::SocketConnection::read((SocketConnector *)pSVar4);
  bVar3 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar3) {
    ppTVar5 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar5;
    ppTVar6 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1b8,*ppTVar6,0x102);
    UnitTest::TestResults::OnTestFailure(this_00,&local_1b8,"!pSocketConnection->read(connector)");
  }
  FIX::SocketConnector::~SocketConnector(local_198);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             local_40);
  return;
}

Assistant:

TEST_FIXTURE(TestSessionConnection, ReadSocket_SessionMissing_NoMessagesRead)
  {
    std::set<SessionID> sessions;
    pSocketConnection.reset(new SocketConnection( socket, sessions, &monitor ));

    SocketConnector connector;
    CHECK(!pSocketConnection->read(connector));
  }